

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O1

Query * q_min_of(Query *__return_storage_ptr__,uint32_t count,
                vector<Query,_std::allocator<Query>_> *queries)

{
  pointer pQVar1;
  
  __return_storage_ptr__->type = MIN_OF;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->ngram).itype = GRAM3;
  (__return_storage_ptr__->ngram).trigram = 0;
  __return_storage_ptr__->count = count;
  pQVar1 = (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish = pQVar1;
  (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

Query q_min_of(uint32_t count, std::vector<Query> &&queries) {
    return Query(count, std::move(queries));
}